

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFieldInfo.h
# Opt level: O0

void __thiscall ser::DataFieldInfo::DataFieldInfo(DataFieldInfo *this,DataFieldInfo *other)

{
  DataFieldInfo *other_local;
  DataFieldInfo *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->type_);
  MetainfoSet::MetainfoSet(&this->metainfo_);
  operator=(this,other);
  return;
}

Assistant:

DataFieldInfo(const DataFieldInfo& other)
        {
            *this = other;
        }